

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpclient.cpp
# Opt level: O0

void uv::TCPClient::AfterConnect(uv_connect_t *handle,int status)

{
  char **ppcVar1;
  TCPClient *t;
  FILE *pFVar2;
  int iVar3;
  CStringStream *pCVar4;
  ILog4zManager *pIVar5;
  undefined8 uVar6;
  long *in_FS_OFFSET;
  undefined1 local_100 [8];
  CStringStream ss_2;
  undefined1 local_c8 [8];
  CStringStream ss_1;
  int iret;
  string local_80;
  undefined1 local_60 [8];
  CStringStream ss;
  TCPClient *parent;
  TcpClientCtx *theclass;
  int status_local;
  uv_connect_t *handle_local;
  
  t = *(TCPClient **)((long)handle->handle->data + 0x1d8);
  if (status == 0) {
    iVar3 = uv_read_start(handle->handle,AllocBufferForRecv,AfterRecv);
    if (iVar3 == 0) {
      t->connectstatus_ = 1;
      zsummer::log4z::CStringStream::CStringStream
                ((CStringStream *)local_100,(char *)(*in_FS_OFFSET + -0x800),0x800);
      pCVar4 = zsummer::log4z::CStringStream::operator<<((CStringStream *)local_100,"client(");
      pCVar4 = zsummer::log4z::CStringStream::operator<<(pCVar4,t);
      zsummer::log4z::CStringStream::operator<<(pCVar4,")run");
      pCVar4 = zsummer::log4z::CStringStream::operator<<((CStringStream *)local_100," ( ");
      pCVar4 = zsummer::log4z::CStringStream::operator<<(pCVar4," ");
      pCVar4 = zsummer::log4z::CStringStream::operator<<(pCVar4," ) : ");
      zsummer::log4z::CStringStream::operator<<(pCVar4,0x122);
      pIVar5 = zsummer::log4z::ILog4zManager::GetInstance();
      (*pIVar5->_vptr_ILog4zManager[8])(pIVar5,0,1,*in_FS_OFFSET + -0x800);
    }
    else {
      ppcVar1 = &ss_1.m_pCur;
      GetUVError_abi_cxx11_((string *)ppcVar1,0);
      std::__cxx11::string::operator=((string *)&t->errmsg_,(string *)ppcVar1);
      std::__cxx11::string::~string((string *)ppcVar1);
      zsummer::log4z::CStringStream::CStringStream
                ((CStringStream *)local_c8,(char *)(*in_FS_OFFSET + -0x800),0x800);
      pCVar4 = zsummer::log4z::CStringStream::operator<<((CStringStream *)local_c8,"client(");
      pCVar4 = zsummer::log4z::CStringStream::operator<<(pCVar4,t);
      pCVar4 = zsummer::log4z::CStringStream::operator<<(pCVar4,") uv_read_start error:");
      std::__cxx11::string::string((string *)&ss_2.m_pCur,(string *)&t->errmsg_);
      zsummer::log4z::CStringStream::operator<<(pCVar4,(string *)&ss_2.m_pCur);
      std::__cxx11::string::~string((string *)&ss_2.m_pCur);
      pCVar4 = zsummer::log4z::CStringStream::operator<<((CStringStream *)local_c8," ( ");
      pCVar4 = zsummer::log4z::CStringStream::operator<<(pCVar4," ");
      pCVar4 = zsummer::log4z::CStringStream::operator<<(pCVar4," ) : ");
      zsummer::log4z::CStringStream::operator<<(pCVar4,0x11d);
      pIVar5 = zsummer::log4z::ILog4zManager::GetInstance();
      (*pIVar5->_vptr_ILog4zManager[8])(pIVar5,0,3,*in_FS_OFFSET + -0x800);
      pFVar2 = _stdout;
      uVar6 = std::__cxx11::string::c_str();
      fprintf(pFVar2,"uv_read_start error:%s\n",uVar6);
      t->connectstatus_ = 2;
    }
    if ((t->isreconnecting_ & 1U) != 0) {
      fprintf(_stdout,"reconnect succeed\n");
      StopReconnect(t);
      if (t->reconnectcb_ != (ReconnectCB)0x0) {
        (*t->reconnectcb_)(NET_EVENT_TYPE_RECONNECT,t->reconnect_userdata_);
      }
    }
  }
  else {
    t->connectstatus_ = 2;
    ppcVar1 = &ss.m_pCur;
    GetUVError_abi_cxx11_((string *)ppcVar1,status);
    std::__cxx11::string::operator=((string *)&t->errmsg_,(string *)ppcVar1);
    std::__cxx11::string::~string((string *)ppcVar1);
    zsummer::log4z::CStringStream::CStringStream
              ((CStringStream *)local_60,(char *)(*in_FS_OFFSET + -0x800),0x800);
    pCVar4 = zsummer::log4z::CStringStream::operator<<((CStringStream *)local_60,"client(");
    pCVar4 = zsummer::log4z::CStringStream::operator<<(pCVar4,t);
    pCVar4 = zsummer::log4z::CStringStream::operator<<(pCVar4,") connect error:");
    std::__cxx11::string::string((string *)&local_80,(string *)&t->errmsg_);
    zsummer::log4z::CStringStream::operator<<(pCVar4,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    pCVar4 = zsummer::log4z::CStringStream::operator<<((CStringStream *)local_60," ( ");
    pCVar4 = zsummer::log4z::CStringStream::operator<<(pCVar4," ");
    pCVar4 = zsummer::log4z::CStringStream::operator<<(pCVar4," ) : ");
    zsummer::log4z::CStringStream::operator<<(pCVar4,0x110);
    pIVar5 = zsummer::log4z::ILog4zManager::GetInstance();
    (*pIVar5->_vptr_ILog4zManager[8])(pIVar5,0,3,*in_FS_OFFSET + -0x800);
    pFVar2 = _stdout;
    uVar6 = std::__cxx11::string::c_str();
    fprintf(pFVar2,"connect error:%s\n",uVar6);
    if ((t->isreconnecting_ & 1U) != 0) {
      uv_timer_stop(&t->reconnect_timer_);
      t->repeat_time_ = t->repeat_time_ << 1;
      uv_timer_start(&t->reconnect_timer_,ReconnectTimer,t->repeat_time_,t->repeat_time_);
    }
  }
  return;
}

Assistant:

void TCPClient::AfterConnect(uv_connect_t* handle, int status)
{
    TcpClientCtx* theclass = (TcpClientCtx*)handle->handle->data;
    TCPClient* parent = (TCPClient*)theclass->parent_server;
    if (status) {
        parent->connectstatus_ = CONNECT_ERROR;
        parent->errmsg_ = GetUVError(status);
        LOGE("client(" << parent << ") connect error:" << parent->errmsg_);
        fprintf(stdout, "connect error:%s\n", parent->errmsg_.c_str());
        if (parent->isreconnecting_) {//reconnect failure, restart timer to trigger reconnect.
            uv_timer_stop(&parent->reconnect_timer_);
            parent->repeat_time_ *= 2;
            uv_timer_start(&parent->reconnect_timer_, TCPClient::ReconnectTimer, parent->repeat_time_, parent->repeat_time_);
        }
        return;
    }

    int iret = uv_read_start(handle->handle, AllocBufferForRecv, AfterRecv);
    if (iret) {
        parent->errmsg_ = GetUVError(status);
        LOGE("client(" << parent << ") uv_read_start error:" << parent->errmsg_);
        fprintf(stdout, "uv_read_start error:%s\n", parent->errmsg_.c_str());
        parent->connectstatus_ = CONNECT_ERROR;
    } else {
        parent->connectstatus_ = CONNECT_FINISH;
        LOGI("client(" << parent << ")run");
    }
    if (parent->isreconnecting_) {
        fprintf(stdout, "reconnect succeed\n");
        parent->StopReconnect();//reconnect succeed.
        if (parent->reconnectcb_) {
            parent->reconnectcb_(NET_EVENT_TYPE_RECONNECT, parent->reconnect_userdata_);
        }
    }
}